

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * attachWithToSelect(Parse *pParse,Select *pSelect,With *pWith)

{
  With *pWith_local;
  Select *pSelect_local;
  Parse *pParse_local;
  
  if (pSelect == (Select *)0x0) {
    sqlite3WithDelete(pParse->db,pWith);
  }
  else {
    pSelect->pWith = pWith;
    parserDoubleLinkSelect(pParse,pSelect);
  }
  return pSelect;
}

Assistant:

static Select *attachWithToSelect(Parse *pParse, Select *pSelect, With *pWith){
    if( pSelect ){
      pSelect->pWith = pWith;
      parserDoubleLinkSelect(pParse, pSelect);
    }else{
      sqlite3WithDelete(pParse->db, pWith);
    }
    return pSelect;
  }